

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::ProgressBar(float fraction,ImVec2 *size_arg,char *overlay)

{
  ImDrawList *draw_list;
  ImVec2 p_min;
  ImVec2 p_max;
  ImGuiContext *pIVar1;
  bool bVar2;
  ImU32 IVar3;
  ImGuiWindow *pIVar4;
  float fVar5;
  float fVar6;
  ImVec2 local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  ImVec2 overlay_size;
  char overlay_buf [32];
  ImVec2 fill_br;
  ImVec2 local_68;
  undefined1 local_60 [8];
  ImRect bb;
  ImVec2 local_48;
  ImVec2 size;
  ImVec2 pos;
  ImGuiStyle *style;
  ImGuiContext *g;
  ImGuiWindow *window;
  char *overlay_local;
  ImVec2 *size_arg_local;
  float fraction_local;
  
  pIVar4 = GetCurrentWindow();
  pIVar1 = GImGui;
  if ((pIVar4->SkipItems & 1U) == 0) {
    size = (pIVar4->DC).CursorPos;
    bb.Max = *size_arg;
    fVar5 = CalcItemWidth();
    fVar6 = (pIVar1->Style).FramePadding.y;
    local_48 = CalcItemSize(bb.Max,fVar5,fVar6 + fVar6 + pIVar1->FontSize);
    local_68 = ::operator+(&size,&local_48);
    ImRect::ImRect((ImRect *)local_60,&size,&local_68);
    ItemSize(&local_48,(pIVar1->Style).FramePadding.y);
    bVar2 = ItemAdd((ImRect *)local_60,0,(ImRect *)0x0,0);
    if (bVar2) {
      fVar6 = ImSaturate(fraction);
      p_min.y = (float)local_60._4_4_;
      p_min.x = (float)local_60._0_4_;
      p_max.y = bb.Min.y;
      p_max.x = bb.Min.x;
      IVar3 = GetColorU32(7,1.0);
      RenderFrame(p_min,p_max,IVar3,true,(pIVar1->Style).FrameRounding);
      ImVec2::ImVec2(&fill_br,-(pIVar1->Style).FrameBorderSize,-(pIVar1->Style).FrameBorderSize);
      ImRect::Expand((ImRect *)local_60,&fill_br);
      fVar5 = ImLerp<float>((float)local_60._0_4_,bb.Min.x,fVar6);
      ImVec2::ImVec2((ImVec2 *)(overlay_buf + 0x18),fVar5,bb.Min.y);
      draw_list = pIVar4->DrawList;
      IVar3 = GetColorU32(0x2a,1.0);
      RenderRectFilledRangeH
                (draw_list,(ImRect *)local_60,IVar3,0.0,fVar6,(pIVar1->Style).FrameRounding);
      window = (ImGuiWindow *)overlay;
      if (overlay == (char *)0x0) {
        ImFormatString((char *)&overlay_size,0x20,"%.0f%%",(double)(fVar6 * 100.0 + 0.01));
        window = (ImGuiWindow *)&overlay_size;
      }
      local_b0 = CalcTextSize((char *)window,(char *)0x0,false,-1.0);
      if (0.0 < local_b0.x) {
        fVar6 = ImClamp<float>((float)overlay_buf._24_4_ + (pIVar1->Style).ItemSpacing.x,
                               (float)local_60._0_4_,
                               (bb.Min.x - local_b0.x) - (pIVar1->Style).ItemInnerSpacing.x);
        ImVec2::ImVec2(&local_b8,fVar6,(float)local_60._4_4_);
        ImVec2::ImVec2(&local_c0,0.0,0.5);
        RenderTextClipped(&local_b8,&bb.Min,(char *)window,(char *)0x0,&local_b0,&local_c0,
                          (ImRect *)local_60);
      }
    }
  }
  return;
}

Assistant:

void ImGui::ProgressBar(float fraction, const ImVec2& size_arg, const char* overlay)
{
    ImGuiWindow* window = GetCurrentWindow();
    if (window->SkipItems)
        return;

    ImGuiContext& g = *GImGui;
    const ImGuiStyle& style = g.Style;

    ImVec2 pos = window->DC.CursorPos;
    ImVec2 size = CalcItemSize(size_arg, CalcItemWidth(), g.FontSize + style.FramePadding.y * 2.0f);
    ImRect bb(pos, pos + size);
    ItemSize(size, style.FramePadding.y);
    if (!ItemAdd(bb, 0))
        return;

    // Render
    fraction = ImSaturate(fraction);
    RenderFrame(bb.Min, bb.Max, GetColorU32(ImGuiCol_FrameBg), true, style.FrameRounding);
    bb.Expand(ImVec2(-style.FrameBorderSize, -style.FrameBorderSize));
    const ImVec2 fill_br = ImVec2(ImLerp(bb.Min.x, bb.Max.x, fraction), bb.Max.y);
    RenderRectFilledRangeH(window->DrawList, bb, GetColorU32(ImGuiCol_PlotHistogram), 0.0f, fraction, style.FrameRounding);

    // Default displaying the fraction as percentage string, but user can override it
    char overlay_buf[32];
    if (!overlay)
    {
        ImFormatString(overlay_buf, IM_ARRAYSIZE(overlay_buf), "%.0f%%", fraction * 100 + 0.01f);
        overlay = overlay_buf;
    }

    ImVec2 overlay_size = CalcTextSize(overlay, NULL);
    if (overlay_size.x > 0.0f)
        RenderTextClipped(ImVec2(ImClamp(fill_br.x + style.ItemSpacing.x, bb.Min.x, bb.Max.x - overlay_size.x - style.ItemInnerSpacing.x), bb.Min.y), bb.Max, overlay, NULL, &overlay_size, ImVec2(0.0f, 0.5f), &bb);
}